

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobian
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixView<double> *outJacobian)

{
  FrameVelocityRepresentation FVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  FrameIndex expressedOriginFrameIndex;
  FrameIndex expressedOrientationFrameIndex;
  MatrixView<double> local_58;
  
  if ((outJacobian->m_rows == 6) &&
     (lVar2 = outJacobian->m_cols, lVar4 = iDynTree::Model::getNrOfDOFs(), lVar2 == lVar4)) {
    FVar1 = this->pimpl->m_frameVelRepr;
    expressedOriginFrameIndex = frameIndex;
    expressedOrientationFrameIndex = refFrameIndex;
    if (((FVar1 != MIXED_REPRESENTATION) &&
        (expressedOrientationFrameIndex = frameIndex, FVar1 != BODY_FIXED_REPRESENTATION)) &&
       (expressedOriginFrameIndex = refFrameIndex, expressedOrientationFrameIndex = refFrameIndex,
       FVar1 != INERTIAL_FIXED_REPRESENTATION)) {
      expressedOriginFrameIndex = FRAME_INVALID_INDEX;
      expressedOrientationFrameIndex = FRAME_INVALID_INDEX;
    }
    local_58.m_storage = outJacobian->m_storage;
    local_58.m_rows = outJacobian->m_rows;
    local_58.m_cols = outJacobian->m_cols;
    local_58.m_storageOrder = outJacobian->m_storageOrder;
    local_58.m_innerStride = outJacobian->m_innerStride;
    local_58.m_outerStride = outJacobian->m_outerStride;
    bVar3 = getRelativeJacobianExplicit
                      (this,refFrameIndex,frameIndex,expressedOriginFrameIndex,
                       expressedOrientationFrameIndex,&local_58);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getRelativeJacobian","Wrong size in input outJacobian");
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool KinDynComputations::getRelativeJacobian(const iDynTree::FrameIndex refFrameIndex,
                                             const iDynTree::FrameIndex frameIndex,
                                             MatrixView<double> outJacobian)
{

    bool ok = (outJacobian.rows() == 6)
        && (outJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs());

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getRelativeJacobian",
                    "Wrong size in input outJacobian");
        return false;
    }

    iDynTree::FrameIndex expressedOriginFrame = iDynTree::FRAME_INVALID_INDEX;
    iDynTree::FrameIndex expressedOrientationFrame = iDynTree::FRAME_INVALID_INDEX;

    if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
        //left trivialized: we want to expressed the information wrt child frame
        expressedOriginFrame = expressedOrientationFrame = frameIndex;

    } else if (pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION) {
        //right trivialized: we want to expressed the information wrt parent frame
        expressedOriginFrame = expressedOrientationFrame = refFrameIndex;
    } else if (pimpl->m_frameVelRepr == MIXED_REPRESENTATION) {
        //Mixed representation: origin as child, orientation as parent
        expressedOriginFrame = frameIndex;
        expressedOrientationFrame = refFrameIndex;
    }

    return getRelativeJacobianExplicit(refFrameIndex, frameIndex, expressedOriginFrame, expressedOrientationFrame, outJacobian);
}